

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthStateMonitor.cpp
# Opt level: O3

void __thiscall PatchNameButton::handleClicked(PatchNameButton *this)

{
  Item *pIVar1;
  SoundGroup *pSVar2;
  PatchNameButton *pPVar3;
  bool bVar4;
  QVariant *pQVar5;
  long lVar6;
  undefined8 a;
  QMetaType QVar7;
  anon_union_24_3_e3d07ef4_for_data *paVar8;
  byte *pbVar9;
  long lVar10;
  long lVar11;
  QByteArrayView QVar12;
  Item item;
  QString timbreName;
  QVector<SoundGroup> groups;
  QMenu menu;
  QMetaType in_stack_ffffffffffffff18;
  undefined1 uVar13;
  undefined8 in_stack_ffffffffffffff20;
  undefined8 local_d8;
  anon_union_24_3_e3d07ef4_for_data local_c0;
  byte local_a8;
  QArrayData *local_a0 [3];
  QArrayDataPointer<SoundGroup> local_88;
  PatchNameButton *local_70;
  long local_68;
  QString *local_60;
  QPoint local_58 [5];
  
  local_88.d = (Data *)0x0;
  local_88.ptr = (SoundGroup *)0x0;
  local_88.size = 0;
  SynthRoute::getSoundGroups(this->synthRoute,(QVector<SoundGroup> *)&local_88);
  local_70 = this;
  QMenu::QMenu((QMenu *)local_58,(QWidget *)this);
  if (0 < local_88.size) {
    lVar6 = 0;
    do {
      pSVar2 = local_88.ptr;
      local_68 = lVar6;
      local_60 = (QString *)QMenu::addMenu((QString *)local_58);
      if (0 < pSVar2[lVar6].constituents.d.size) {
        lVar11 = 0;
        lVar10 = 0;
        do {
          pIVar1 = pSVar2[lVar6].constituents.d.ptr;
          QString::trimmed_helper((QString *)local_c0.data);
          pbVar9 = &pIVar1->field_0x0 + lVar11;
          if (local_c0._16_8_ == 0) {
            QString::number((uint)local_a0,(uint)(*pbVar9 >> 2));
            QVar12.m_data = (storage_type *)0xf;
            QVar12.m_size = (qsizetype)&stack0xffffffffffffff20;
            QString::fromUtf8(QVar12);
            QString::append((QString *)&stack0xffffffffffffff20);
            QString::operator=((QString *)&local_c0,(QString *)&stack0xffffffffffffff20);
            if ((QArrayData *)in_stack_ffffffffffffff20 != (QArrayData *)0x0) {
              LOCK();
              *(int *)in_stack_ffffffffffffff20 = *(int *)in_stack_ffffffffffffff20 + -1;
              UNLOCK();
              if (*(int *)in_stack_ffffffffffffff20 == 0) {
                QArrayData::deallocate((QArrayData *)in_stack_ffffffffffffff20,2,8);
              }
            }
            if (local_a0[0] != (QArrayData *)0x0) {
              LOCK();
              (local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_a0[0],2,8);
              }
            }
          }
          pQVar5 = (QVariant *)QMenu::addAction(local_60);
          QVariant::QVariant((QVariant *)&stack0xffffffffffffff20,(QMetaType)0x1d0a78,pbVar9);
          QAction::setData(pQVar5);
          QVariant::~QVariant((QVariant *)&stack0xffffffffffffff20);
          if ((QArrayData *)local_c0.shared != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_c0.shared = *(int *)local_c0.shared + -1;
            UNLOCK();
            if (*(int *)local_c0.shared == 0) {
              QArrayData::deallocate((QArrayData *)local_c0.shared,2,8);
            }
          }
          lVar10 = lVar10 + 1;
          lVar11 = lVar11 + 0x20;
        } while (lVar10 < pSVar2[lVar6].constituents.d.size);
      }
      lVar6 = local_68 + 1;
    } while (lVar6 < local_88.size);
  }
  pPVar3 = local_70;
  local_a0[0] = (QArrayData *)
                CONCAT44(*(undefined4 *)(*(long *)&local_70->field_0x20 + 0x20),
                         *(undefined4 *)(*(long *)&local_70->field_0x20 + 0x14));
  local_c0.shared = (PrivateShared *)QWidget::mapFromParent((QPoint *)local_70);
  a = QWidget::mapToGlobal((QPoint *)pPVar3);
  lVar6 = QMenu::exec(local_58,(QAction *)&stack0xffffffffffffff20);
  if (lVar6 != 0) {
    paVar8 = &local_c0;
    QAction::data();
    bVar4 = operator==((QMetaType)a,in_stack_ffffffffffffff18);
    if (bVar4) {
      if ((local_a8 & 1) != 0) {
        paVar8 = (anon_union_24_3_e3d07ef4_for_data *)
                 (local_c0.shared + *(int *)(local_c0.shared + 4));
      }
      uVar13 = paVar8->data[0];
      local_d8 = *(undefined8 *)(paVar8->data + 8);
      if ((QArrayData *)local_d8 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_d8)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_d8)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      uVar13 = 0;
      local_d8 = (QArrayData *)0x0;
      paVar8 = &local_c0;
      QVar7.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if ((local_a8 & 1) != 0) {
        paVar8 = (anon_union_24_3_e3d07ef4_for_data *)
                 (local_c0.shared + *(int *)(local_c0.shared + 4));
      }
      QMetaType::convert(QVar7,paVar8,(QMetaType)0x1d0a78,&stack0xffffffffffffff20);
    }
    QVariant::~QVariant((QVariant *)&local_c0);
    SynthRoute::setTimbreOnPart
              (pPVar3->synthRoute,pPVar3->partNumber,(byte)uVar13 & 3,(uint)((byte)uVar13 >> 2));
    if ((QArrayData *)local_d8 != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_d8 = *(int *)local_d8 + -1;
      UNLOCK();
      if (*(int *)local_d8 == 0) {
        QArrayData::deallocate((QArrayData *)local_d8,2,8);
      }
    }
  }
  QMenu::~QMenu((QMenu *)local_58);
  QArrayDataPointer<SoundGroup>::~QArrayDataPointer(&local_88);
  return;
}

Assistant:

void PatchNameButton::handleClicked() {
	QVector<SoundGroup> groups;
	synthRoute.getSoundGroups(groups);

	QMenu menu(this);
	QMenu *groupMenu = NULL;
	for (int groupIx = 0; groupIx < groups.size(); groupIx++) {
		const SoundGroup &group = groups.at(groupIx);
		groupMenu = menu.addMenu(group.name);
		const QVector<SoundGroup::Item> &items = group.constituents;
		for (int itemIx = 0; itemIx < items.size(); itemIx++) {
			const SoundGroup::Item &item = items.at(itemIx);
			QString timbreName = item.timbreName.trimmed();
			if (timbreName.isEmpty()) {
				timbreName = "Memory Timbre #" + QString::number(item.timbreNumber);
			}
			groupMenu->addAction(timbreName)->setData(QVariant::fromValue(item));
		}
	}
	QAction *triggeredAction = menu.exec(mapToGlobal(mapFromParent(geometry().bottomLeft())));
	if (triggeredAction != NULL) {
		SoundGroup::Item item = triggeredAction->data().value<SoundGroup::Item>();
		synthRoute.setTimbreOnPart(partNumber, item.timbreGroup, item.timbreNumber);
	}
}